

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterBuffer.h
# Opt level: O2

hash_t JsUtil::CharacterBuffer<char>::InternalGetHashCode<false>(char *s,charcount_t length)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = 0x811c9dc5;
  for (uVar2 = 0; length != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = (uVar1 ^ (int)s[uVar2]) * 0x1000193;
  }
  return uVar1;
}

Assistant:

static hash_t InternalGetHashCode(__in_z T const * s, __in charcount_t length)
        {
            hash_t hash = CC_HASH_OFFSET_VALUE;
            charcount_t hashLength = length;
            if (fastHash)
            {
                hashLength = min(length, MAX_FAST_HASH_LENGTH);
            }
            for (charcount_t i = 0; i < hashLength; i++)
            {
                CC_HASH_LOGIC(hash, s[i]);
            }
            return hash;
        }